

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O2

RK_S32 __thiscall mpp_list::del_at_tail(mpp_list *this,void *data,RK_S32 size)

{
  RK_S32 RVar1;
  
  RVar1 = -0x16;
  if ((this->head != (mpp_list_node *)0x0) && (this->count != 0)) {
    _list_del_node_no_lock(this->head->prev,data,size);
    this->count = this->count + -1;
    RVar1 = 0;
  }
  return RVar1;
}

Assistant:

RK_S32 mpp_list::del_at_tail(void *data, RK_S32 size)
{
    RK_S32 ret = -EINVAL;
    if (head && count) {
        _list_del_node_no_lock(head->prev, data, size);
        count--;
        ret = 0;
    }
    return ret;
}